

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_invocable.h
# Opt level: O3

void absl::lts_20250127::internal_any_invocable::
     RemoteInvoker<false,void,google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeOneField(google::protobuf::io::Printer*,google::protobuf::FieldDescriptor_const*,int)::__0&>
               (TypeErasedState *state)

{
  long *plVar1;
  FieldGenerator *this;
  
  plVar1 = (long *)(state->remote).target;
  this = google::protobuf::compiler::cpp::FieldGeneratorTable::get
                   ((FieldGeneratorTable *)(*plVar1 + 0xe8),*(FieldDescriptor **)plVar1[1]);
  google::protobuf::compiler::cpp::FieldGenerator::GenerateSerializeWithCachedSizesToArray
            (this,*(Printer **)plVar1[2]);
  return;
}

Assistant:

ReturnType RemoteInvoker(
    TypeErasedState* const state,
    ForwardedParameterType<P>... args) noexcept(SigIsNoexcept) {
  using RawT = RemoveCVRef<QualTRef>;
  static_assert(!IsStoredLocally<RawT>::value,
                "Target object must be in remote storage in order to be "
                "invoked from it.");

  auto& f = *static_cast<RawT*>(state->remote.target);
  return (InvokeR<ReturnType>)(static_cast<QualTRef>(f),
                               static_cast<ForwardedParameterType<P>>(args)...);
}